

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportInstallFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  _Base_ptr p_Var1;
  cmFileSet *pcVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  mapped_type *ppcVar6;
  string *psVar7;
  ostream *poVar8;
  string *psVar9;
  _Rb_tree_node_base *p_Var10;
  pointer config;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  _Base_ptr filename;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view str_00;
  string_view separator;
  char local_3b1;
  cmFileSet *fileSet_local;
  string *local_3a8;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  destCge;
  string relFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmAlphaNum local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  cmExportInstallFileGenerator *local_2d0;
  string *local_2c8;
  cmMakefile *local_2c0;
  string escapedFile;
  string prefix;
  cmGeneratorExpression destGe;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  string local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string dest;
  string local_1c8 [32];
  ostringstream e;
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fileSet_local = fileSet;
  local_3a8 = __return_storage_ptr__;
  local_2d0 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&fileEntries,fileSet);
  cmFileSet::CompileDirectoryEntries(&directoryEntries,fileSet_local);
  local_2e8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2e8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_2e8);
  cmGeneratorExpression::cmGeneratorExpression(&destGe,(cmListFileBacktrace *)&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ppcVar6 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&fileSet_local);
  std::__cxx11::string::string
            (local_1c8,(string *)&((*ppcVar6)->super_cmInstallGenerator).Destination);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&destCge,(string *)&destGe);
  std::__cxx11::string::~string(local_1c8);
  local_2c8 = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2d8 = &local_3a8->field_2;
  config = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (config == local_2c8) goto LAB_0040c5e0;
    cmFileSet::EvaluateDirectoryEntries
              (&directories,fileSet_local,&directoryEntries,gte->LocalGenerator,config,gte,
               (cmGeneratorExpressionDAGChecker *)0x0);
    puVar3 = fileEntries.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &files._M_t._M_impl.super__Rb_tree_header._M_header;
    files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (cge = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; cge != puVar3; cge = cge + 1) {
      cmFileSet::EvaluateFileEntry
                (fileSet_local,&directories,&files,cge,gte->LocalGenerator,config,gte,
                 (cmGeneratorExpressionDAGChecker *)0x0);
    }
    _e = (_Base_ptr)0x12;
    relFile._M_dataplus._M_p = (pointer)&relFile.field_2;
    relFile._M_string_length = 0;
    relFile.field_2._M_local_buf[0] = '\0';
    psVar9 = (string *)0x0;
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        destCge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        gte->LocalGenerator,config,gte,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,&relFile);
    str._M_str = (char *)0x1;
    str._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&prefix,(cmOutputConverter *)psVar7->_M_string_length,str,(WrapQuotes)psVar9);
    local_348.View_._M_len = prefix._M_string_length;
    local_348.View_._M_str = prefix._M_dataplus._M_p;
    escapedFile._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<char>(&dest,(cmAlphaNum *)&e,&local_348,(char *)&escapedFile);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&relFile);
    if (((*(char *)((long)destCge._M_t.
                          super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                          .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                          _M_head_impl + 0x130) != '\0') ||
        (bVar4 = std::
                 any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                           ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                             )directoryEntries.
                              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                             )directoryEntries.
                              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                            anon_unknown.dwarf_176f81a::EntryIsContextSensitive), bVar4)) ||
       (bVar4 = std::
                any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                          ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                            )fileEntries.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                            )fileEntries.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           anon_unknown.dwarf_176f81a::EntryIsContextSensitive), bVar4)) {
      pcVar2 = fileSet_local;
      __x._M_str = (fileSet_local->Type)._M_dataplus._M_p;
      __x._M_len = (fileSet_local->Type)._M_string_length;
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      bVar4 = std::operator==(__x,__y);
      if (!bVar4) {
        __x_00._M_str = (pcVar2->Type)._M_dataplus._M_p;
        __x_00._M_len = (pcVar2->Type)._M_string_length;
        __y_00._M_str = "CXX_MODULE_HEADER_UNITS";
        __y_00._M_len = 0x17;
        bVar5 = std::operator==(__x_00,__y_00);
        bVar4 = true;
        p_Var10 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (!bVar5) goto LAB_0040c2d3;
      }
      local_2c0 = local_2d0->IEGen->LocalGenerator->Makefile;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"The \"");
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,"\" target\'s interface file set \"");
      poVar8 = std::operator<<(poVar8,(string *)fileSet_local);
      poVar8 = std::operator<<(poVar8,"\" of type \"");
      poVar8 = std::operator<<(poVar8,(string *)&pcVar2->Type);
      std::operator<<(poVar8,
                      "\" contains context-sensitive base file entries which is not supported.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(local_2c0,FATAL_ERROR,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      (local_3a8->_M_dataplus)._M_p = (pointer)local_2d8;
      local_3a8->_M_string_length = 0;
      (local_3a8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar5 = false;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      p_Var10 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0040c2d3:
      for (; (_Rb_tree_header *)p_Var10 != &files._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        if (p_Var10[1]._M_parent == (_Base_ptr)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&prefix,"",(allocator<char> *)&relFile);
        }
        else {
          local_348.View_._M_len = 1;
          local_348.View_._M_str = local_348.Digits_;
          local_348.Digits_[0] = '/';
          _e = p_Var10[1]._M_parent;
          cmStrCat<>(&prefix,(cmAlphaNum *)&e,&local_348);
        }
        p_Var1 = p_Var10[2]._M_parent;
        for (filename = *(_Base_ptr *)(p_Var10 + 2); filename != p_Var1; filename = filename + 1) {
          _e = (_Base_ptr)prefix._M_string_length;
          cmsys::SystemTools::GetFilenameName(&escapedFile,(string *)filename);
          local_348.View_._M_str =
               (char *)CONCAT71(escapedFile._M_dataplus._M_p._1_7_,
                                escapedFile._M_dataplus._M_p._0_1_);
          local_348.View_._M_len = escapedFile._M_string_length;
          cmStrCat<>(&relFile,(cmAlphaNum *)&e,&local_348);
          std::__cxx11::string::~string((string *)&escapedFile);
          _e = (_Base_ptr)dest._M_string_length;
          str_00._M_str = (char *)0x1;
          str_00._M_len = (size_t)relFile._M_dataplus._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_220,(cmOutputConverter *)relFile._M_string_length,str_00,
                     (WrapQuotes)psVar9);
          local_348.View_._M_len = local_220._M_string_length;
          local_348.View_._M_str = local_220._M_dataplus._M_p;
          cmStrCat<>(&escapedFile,(cmAlphaNum *)&e,&local_348);
          std::__cxx11::string::~string((string *)&local_220);
          if ((bVar4) &&
             ((long)configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
            _e = (_Base_ptr)0xc;
            local_348.View_._M_str = (config->_M_dataplus)._M_p;
            local_348.View_._M_len = config->_M_string_length;
            psVar9 = &escapedFile;
            cmStrCat<char[3],std::__cxx11::string,char[3]>
                      (&local_220,(cmAlphaNum *)&e,&local_348,(char (*) [3])">:",&escapedFile,
                       (char (*) [3])">\"");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &resultVector,&local_220);
          }
          else {
            _e = (_Base_ptr)0x1;
            local_348.View_._M_str =
                 (char *)CONCAT71(escapedFile._M_dataplus._M_p._1_7_,
                                  escapedFile._M_dataplus._M_p._0_1_);
            local_348.View_._M_len = escapedFile._M_string_length;
            local_3b1 = '\"';
            cmStrCat<char>(&local_220,(cmAlphaNum *)&e,&local_348,&local_3b1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &resultVector,&local_220);
          }
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&escapedFile);
          std::__cxx11::string::~string((string *)&relFile);
        }
        std::__cxx11::string::~string((string *)&prefix);
      }
      bVar5 = bVar4 && (long)configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start != 0x20;
      bVar4 = !bVar4 || (long)configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start == 0x20;
    }
    std::__cxx11::string::~string((string *)&dest);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&files._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&directories);
    config = config + 1;
  } while (bVar5);
  if (bVar4) {
LAB_0040c5e0:
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(local_3a8,&resultVector,separator,(string_view)ZEXT816(0));
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&destCge);
  cmGeneratorExpression::~cmGeneratorExpression(&destGe);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&directoryEntries);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&fileEntries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resultVector);
  return local_3a8;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  cmGeneratorExpression destGe;
  auto destCge =
    destGe.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           destCge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap),
                         '/');

    bool const contextSensitive = destCge->GetHadContextSensitiveCondition() ||
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      auto prefix = it.first.empty() ? "" : cmStrCat(it.first, '/');
      for (auto const& filename : it.second) {
        auto relFile =
          cmStrCat(prefix, cmSystemTools::GetFilenameName(filename));
        auto escapedFile =
          cmStrCat(dest,
                   cmOutputConverter::EscapeForCMake(
                     relFile, cmOutputConverter::WrapQuotes::NoWrap));
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.push_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}